

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_map(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  CVmObject *pCVar2;
  vm_val_t *pvVar3;
  undefined4 *in_RCX;
  vm_rcdesc *in_RSI;
  vm_val_t *in_RDI;
  vm_rcdesc rc;
  CVmObjList *new_lst_obj;
  char *new_lst;
  size_t idx;
  size_t cnt;
  vm_val_t *func_val;
  uint orig_argc;
  CVmObject *in_stack_ffffffffffffff28;
  vm_val_t *in_stack_ffffffffffffff30;
  vm_val_t *in_stack_ffffffffffffff38;
  vm_rcdesc *recurse_ctx;
  vm_val_t *in_stack_ffffffffffffff40;
  vm_val_t *this;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar4;
  CVmRun *in_stack_ffffffffffffff50;
  vm_val_t *local_48;
  
  if (in_RCX == (undefined4 *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = *in_RCX;
  }
  if ((getp_map(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_map(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_map::desc,1);
    __cxa_guard_release(&getp_map(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff38,&in_stack_ffffffffffffff30->typ,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff28);
  if (iVar1 == 0) {
    recurse_ctx = in_RSI;
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              ((vm_rcdesc *)in_stack_ffffffffffffff50,
               (char *)CONCAT44(uVar4,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40,
               (unsigned_short)((ulong)recurse_ctx >> 0x30),in_stack_ffffffffffffff30,
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    CVmStack::get(0);
    CVmStack::push((vm_val_t *)in_RSI);
    this = in_RDI;
    obj = create((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(char *)in_stack_ffffffffffffff28);
    vm_val_t::set_obj(this,obj);
    pCVar2 = vm_objp(0);
    pvVar3 = (vm_val_t *)vmb_get_len((char *)0x3183c9);
    CVmStack::push(in_RDI);
    for (local_48 = (vm_val_t *)0x0; local_48 < pvVar3;
        local_48 = (vm_val_t *)((long)&local_48->typ + 1)) {
      index_and_push((char *)in_stack_ffffffffffffff30,
                     (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      CVmRun::call_func_ptr
                (in_stack_ffffffffffffff50,(vm_val_t *)CONCAT44(uVar4,in_stack_ffffffffffffff48),
                 (uint)((ulong)this >> 0x20),recurse_ctx,
                 (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      in_stack_ffffffffffffff28 = pCVar2;
      in_stack_ffffffffffffff30 = local_48;
      CVmRun::get_r0();
      cons_set_element((CVmObjList *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                       (vm_val_t *)0x31846b);
    }
    CVmStack::discard(3);
  }
  return 1;
}

Assistant:

int CVmObjList::getp_map(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                         const char *lst, uint *argc)
{
    uint orig_argc = (argc != 0 ? *argc : 0);
    const vm_val_t *func_val;
    size_t cnt;
    size_t idx;
    char *new_lst;
    CVmObjList *new_lst_obj;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set up the recursive caller context */
    vm_rcdesc rc(vmg_ "List.mapAll", self_val, 2, G_stk->get(0), orig_argc);

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while allocating to protect from gc */
    G_stk->push(self_val);

    /* 
     *   Make a copy of our list for the return value, since the result
     *   value is always the same size as our current list.  By making a
     *   copy of the input list, we also can avoid worrying about whether
     *   the input list was a constant, and hence we don't have to worry
     *   about the possibility of constant page swapping - we'll just
     *   update elements of the copy in-place.  
     */
    retval->set_obj(create(vmg_ FALSE, lst));

    /* get the return value list data */
    new_lst_obj = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
    new_lst = new_lst_obj->ext_;

    /* get the length of the list */
    cnt = vmb_get_len(new_lst);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our list, and invoke the callback on
     *   each element.  Replace each element with the result of the
     *   callback.  
     */
    for (idx = 0 ; idx < cnt ; ++idx)
    {
        /* 
         *   get this element (using a 1-based index), and push it as the
         *   callback's argument 
         */
        index_and_push(vmg_ new_lst, idx + 1);
        
        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* store the result in the list */
        new_lst_obj->cons_set_element(idx, G_interpreter->get_r0());
    }

    /* discard our gc protection (self, return value) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}